

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

int fl_ready(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  fd_set *pfVar4;
  fd_set *pfVar5;
  byte bVar6;
  fd_set fdt [3];
  timeval local_198;
  fd_set local_188;
  fd_set local_108;
  fd_set local_88;
  
  bVar6 = 0;
  iVar1 = XQLength(fl_display);
  iVar2 = 1;
  if (iVar1 == 0) {
    if (nfds == 0) {
      iVar2 = 0;
    }
    else {
      local_198.tv_sec = 0;
      local_198.tv_usec = 0;
      pfVar4 = fdsets;
      pfVar5 = &local_188;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        pfVar5->fds_bits[0] = pfVar4->fds_bits[0];
        pfVar4 = (fd_set *)((long)pfVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pfVar5 = (fd_set *)((long)pfVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      pfVar4 = fdsets + 1;
      pfVar5 = &local_108;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        pfVar5->fds_bits[0] = pfVar4->fds_bits[0];
        pfVar4 = (fd_set *)((long)pfVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pfVar5 = (fd_set *)((long)pfVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      pfVar4 = fdsets + 2;
      pfVar5 = &local_88;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        pfVar5->fds_bits[0] = pfVar4->fds_bits[0];
        pfVar4 = (fd_set *)((long)pfVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pfVar5 = (fd_set *)((long)pfVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      iVar2 = select(maxfd + 1,&local_188,&local_108,&local_88,&local_198);
    }
  }
  return iVar2;
}

Assistant:

int fl_ready() {
  if (XQLength(fl_display)) return 1;
  if (!nfds) return 0; // nothing to select or poll
#  if USE_POLL
  return ::poll(pollfds, nfds, 0);
#  else
  timeval t;
  t.tv_sec = 0;
  t.tv_usec = 0;
  fd_set fdt[3];
  fdt[0] = fdsets[0];
  fdt[1] = fdsets[1];
  fdt[2] = fdsets[2];
  return ::select(maxfd+1,&fdt[0],&fdt[1],&fdt[2],&t);
#  endif
}